

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O1

void __thiscall MeCab::anon_unknown_0::LatticeImpl::clear(LatticeImpl *this)

{
  Allocator<mecab_node_t,_mecab_path_t> *pAVar1;
  FreeList<mecab_node_t> *pFVar2;
  FreeList<mecab_path_t> *pFVar3;
  ChunkFreeList<char> *pCVar4;
  StringBuffer *pSVar5;
  pointer ppmVar6;
  pointer ppcVar7;
  pointer puVar8;
  
  pAVar1 = (this->allocator_).ptr_;
  pAVar1->id_ = 0;
  pFVar2 = (pAVar1->node_freelist_).ptr_;
  pFVar2->pi_ = 0;
  pFVar2->li_ = 0;
  pFVar3 = (pAVar1->path_freelist_).ptr_;
  if (pFVar3 != (FreeList<mecab_path_t> *)0x0) {
    pFVar3->pi_ = 0;
    pFVar3->li_ = 0;
  }
  pCVar4 = (pAVar1->char_freelist_).ptr_;
  if (pCVar4 != (ChunkFreeList<char> *)0x0) {
    pCVar4->pi_ = 0;
    pCVar4->li_ = 0;
  }
  pSVar5 = (this->ostrs_).ptr_;
  if (pSVar5 != (StringBuffer *)0x0) {
    pSVar5->size_ = 0;
  }
  ppmVar6 = (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppmVar6) {
    (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppmVar6;
  }
  ppmVar6 = (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppmVar6) {
    (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppmVar6;
  }
  ppcVar7 = (this->feature_constraint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar7) {
    (this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar7;
  }
  puVar8 = (this->boundary_constraint_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar8) {
    (this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar8;
  }
  this->theta_ = 0.75;
  this->Z_ = 0.0;
  this->sentence_ = (char *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

T * get() const         { return ptr_;  }